

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::jump_zero(Simulator *this,PCode *code)

{
  int iVar1;
  int iVar2;
  mapped_type *pmVar3;
  _Elt_pointer pSVar4;
  StackSymbol symbol;
  StackSymbol local_60;
  
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->label_table_,&code->first_);
  iVar1 = *pmVar3;
  pSVar4 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar4 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar4 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  StackSymbol::StackSymbol(&local_60,pSVar4 + -1);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  iVar2 = this->eip_ + 1;
  if (local_60.value_.int_value == 0) {
    iVar2 = iVar1;
  }
  this->eip_ = iVar2;
  StackSymbol::UnionValue::~UnionValue(&local_60.value_);
  return;
}

Assistant:

void Simulator::jump_zero(const PCode &code) {
    int target = label_table_[code.first()];
    StackSymbol symbol = stack_.back();
    stack_.pop_back();
    if (symbol.int_value() == 0) {
        set_eip(target);
    } else {
        inc_eip();
    }
}